

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
* __thiscall
google::protobuf::anon_unknown_24::
FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::Pointers(FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this)

{
  int iVar1;
  int iVar2;
  PointerT<google::protobuf::FileDescriptorTables> pFVar3;
  int begin;
  int begin_1;
  TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *in_RDI;
  PointerT<google::protobuf::FileDescriptorTables> pFVar4;
  
  iVar1 = (this->ends_).payload_.super_Base<char>.value;
  pFVar3 = (PointerT<google::protobuf::FileDescriptorTables>)0x0;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)(this + 1);
  if (iVar1 == 0x38) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<char>.value = (PointerT<char>)pFVar4;
  iVar2 = (this->ends_).payload_.
          super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = (PointerT<std::__cxx11::basic_string<char>_>)pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)pFVar4;
  iVar2 = (this->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::FileDescriptorTables>.value = pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::FeatureSet>.value =
       (PointerT<google::protobuf::FeatureSet>)pFVar4;
  iVar2 = (this->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::MessageOptions>.value =
       (PointerT<google::protobuf::MessageOptions>)pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::FieldOptions>.value =
       (PointerT<google::protobuf::FieldOptions>)pFVar4;
  iVar2 = (this->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::EnumOptions>.value =
       (PointerT<google::protobuf::EnumOptions>)pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::EnumValueOptions>.value =
       (PointerT<google::protobuf::EnumValueOptions>)pFVar4;
  iVar2 = (this->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::ExtensionRangeOptions>.value =
       (PointerT<google::protobuf::ExtensionRangeOptions>)pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::OneofOptions>.value =
       (PointerT<google::protobuf::OneofOptions>)pFVar4;
  iVar2 = (this->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == iVar2) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::ServiceOptions>.value =
       (PointerT<google::protobuf::ServiceOptions>)pFVar4;
  iVar1 = (this->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar2);
  if (iVar2 == iVar1) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::MethodOptions>.value =
       (PointerT<google::protobuf::MethodOptions>)pFVar4;
  pFVar4 = (PointerT<google::protobuf::FileDescriptorTables>)
           ((long)&(this->ends_).payload_.super_Base<char>.value + (long)iVar1);
  if (iVar1 == (this->ends_).payload_.super_Base<google::protobuf::FileOptions>.value) {
    pFVar4 = pFVar3;
  }
  (in_RDI->payload_).super_Base<google::protobuf::FileOptions>.value =
       (PointerT<google::protobuf::FileOptions>)pFVar4;
  return in_RDI;
}

Assistant:

int EndOffset() const {
    return ends_.template Get<U>();
  }